

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O3

bool cmExportCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  pointer pbVar1;
  cmGeneratorTarget *pcVar2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  pointer pTVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  TargetType TVar10;
  PolicyStatus PVar11;
  undefined8 *puVar12;
  ostream *poVar13;
  long *plVar14;
  PackageDependency *pPVar15;
  string *psVar16;
  cmGlobalGenerator *pcVar17;
  cmTarget *this;
  cmExportBuildFileGenerator *pcVar18;
  iterator iVar19;
  size_t sVar20;
  PackageDependencyExportEnabled PVar21;
  offset_in_Arguments_to_bool member;
  _Any_data *p_Var22;
  PolicyID id;
  char *pcVar23;
  char *extraout_RDX;
  string *ct;
  undefined8 config;
  size_t sVar24;
  cmExportSet *pcVar25;
  undefined8 uVar26;
  pointer pTVar27;
  pointer pTVar28;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  static_string_view name_06;
  static_string_view name_07;
  static_string_view name_08;
  static_string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view value;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view name_12;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view input;
  string_view value_00;
  vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
  targets;
  PackageDependencyArguments packageDependencyArguments;
  string fname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  string package;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  cmCryptoHash hasher;
  cmArgumentParser<Arguments> parser;
  Arguments arguments;
  undefined1 auStack_738 [8];
  cmExecutionStatus *local_730;
  _Any_data local_728;
  code *local_718;
  code *local_710;
  _Any_data local_708;
  undefined1 local_6f8 [16];
  undefined1 local_6e8 [24];
  size_type sStack_6d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6c8;
  pointer local_6b8;
  undefined1 auStack_6b0 [32];
  _Alloc_hider local_690;
  undefined1 local_688 [16];
  undefined1 local_678 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_670;
  undefined1 auStack_650 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_640;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_630;
  _Alloc_hider _Stack_620;
  undefined1 local_610 [8];
  undefined1 local_608 [16];
  undefined1 local_5f8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  cmExportSet *local_5c0;
  char *local_5b8;
  long local_5b0;
  char local_5a8 [16];
  _Any_data local_598;
  undefined1 local_588 [48];
  _Base_ptr local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_550;
  undefined1 auStack_540 [24];
  ios_base local_528 [512];
  cmCryptoHash local_328;
  string local_318;
  undefined1 local_2f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  _Manager_type local_2d0;
  pointer local_2c8;
  _Any_data local_2c0;
  _Alloc_hider local_2b0;
  _Base_ptr local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  _Alloc_hider local_290;
  size_type local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  _Alloc_hider local_270 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  char local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_220;
  _Base_ptr local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  string local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  pointer local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  size_t local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  undefined2 local_1a0;
  pointer local_198;
  undefined1 local_190;
  undefined7 uStack_18f;
  undefined1 uStack_188;
  undefined8 uStack_187;
  pointer local_178;
  pointer pTStack_170;
  cmLocalGenerator *local_168;
  undefined8 local_50;
  void *local_40;
  undefined4 local_38;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_730 = status;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    local_598._M_unused._M_object = local_588;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_598,"called with too few arguments","");
    std::__cxx11::string::_M_assign((string *)&local_730->Error);
    if ((undefined1 *)local_598._M_unused._0_8_ != local_588) {
      operator_delete(local_598._M_unused._M_object,local_588._0_8_ + 1);
    }
    return false;
  }
  iVar9 = std::__cxx11::string::compare((char *)pbVar1);
  if (iVar9 != 0) {
    auStack_540._8_8_ = (pointer)0x0;
    auStack_540._16_8_ = (pointer)0x0;
    aStack_550._8_8_ = (pointer)0x0;
    auStack_540._0_8_ = (pointer)0x0;
    local_558 = (_Base_ptr)0x0;
    aStack_550._M_allocated_capacity = 0;
    local_588._32_8_ = 0;
    local_588._40_8_ = (pointer)0x0;
    local_588._16_8_ = (pointer)0x0;
    local_588._24_8_ = (code *)0x0;
    local_588._0_8_ = (cmExportSet *)0x0;
    local_588._8_8_ = (code *)0x0;
    local_598._M_unused._M_object = (void *)0x0;
    local_598._8_8_ = 0;
    name.super_string_view._M_str = "NAMESPACE";
    name.super_string_view._M_len = 9;
    cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_598._M_pod_data,name,0x40);
    name_00.super_string_view._M_str = "FILE";
    name_00.super_string_view._M_len = 4;
    cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_598._M_pod_data,name_00,0x60);
    name_01.super_string_view._M_str = "CXX_MODULES_DIRECTORY";
    name_01.super_string_view._M_len = 0x15;
    cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_598._M_pod_data,name_01,0xa0);
    ArgumentParser::ActionMap::ActionMap((ActionMap *)local_2f8,(ActionMap *)&local_598);
    std::
    vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ::~vector((vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
               *)auStack_540);
    if ((pointer)aStack_550._M_allocated_capacity != (pointer)0x0) {
      (*(code *)aStack_550._M_allocated_capacity)(local_588 + 0x28,local_588 + 0x28,3);
    }
    if ((code *)local_588._24_8_ != (code *)0x0) {
      (*(code *)local_588._24_8_)(local_588 + 8,local_588 + 8,3);
    }
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
               *)&local_598);
    iVar9 = std::__cxx11::string::compare
                      ((char *)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
    if (iVar9 == 0) {
      name_05.super_string_view._M_str = "EXPORT";
      name_05.super_string_view._M_len = 6;
      cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)local_2f8,name_05,0);
      bVar8 = cmExperimental::HasSupportEnabled(local_730->Makefile,ExportPackageDependencies);
      if (bVar8) {
        member = 0xe0;
        pcVar23 = "EXPORT_PACKAGE_DEPENDENCIES";
        sVar24 = 0x1b;
        goto LAB_0020ad83;
      }
    }
    else {
      iVar9 = std::__cxx11::string::compare
                        ((char *)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
      if (iVar9 == 0) {
        name_07.super_string_view._M_str = "SETUP";
        name_07.super_string_view._M_len = 5;
        cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
        ::Bind<std::__cxx11::string>
                  ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                    *)local_2f8,name_07,0);
        bVar8 = cmExperimental::HasSupportEnabled(local_730->Makefile,ExportPackageDependencies);
        if (bVar8) {
          name_08.super_string_view._M_str = "PACKAGE_DEPENDENCY";
          name_08.super_string_view._M_len = 0x12;
          cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
          ::
          Bind<std::vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                    ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                      *)local_2f8,name_08,200);
        }
        name_09.super_string_view._M_str = "TARGET";
        name_09.super_string_view._M_len = 6;
        cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
        ::
        Bind<std::vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                  ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                    *)local_2f8,name_09,0xe8);
      }
      else {
        local_598._8_8_ = 0;
        local_598._M_unused._M_member_pointer = 0x20;
        local_588._8_8_ =
             std::
             _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
             ::_M_invoke;
        local_588._0_8_ =
             std::
             _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
             ::_M_manager;
        name_02._M_str = "TARGETS";
        name_02._M_len = 7;
        ArgumentParser::Base::Bind((Base *)local_2f8,name_02,(KeywordAction *)&local_598);
        if ((cmExportSet *)local_588._0_8_ != (cmExportSet *)0x0) {
          (*(code *)local_588._0_8_)(&local_598,&local_598,3);
        }
        name_03.super_string_view._M_str = "ANDROID_MK";
        name_03.super_string_view._M_len = 10;
        cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
        ::Bind<std::__cxx11::string>
                  ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                    *)local_2f8,name_03,0x80);
        name_04.super_string_view._M_str = "APPEND";
        name_04.super_string_view._M_len = 6;
        cmArgumentParser<Arguments>::Bind<bool>
                  ((cmArgumentParser<Arguments> *)local_2f8,name_04,0xc0);
        member = 0xc1;
        pcVar23 = "EXPORT_LINK_INTERFACE_LIBRARIES";
        sVar24 = 0x1f;
LAB_0020ad83:
        name_06.super_string_view._M_str = pcVar23;
        name_06.super_string_view._M_len = sVar24;
        cmArgumentParser<Arguments>::Bind<bool>
                  ((cmArgumentParser<Arguments> *)local_2f8,name_06,member);
      }
    }
    local_588._0_8_ = local_608;
    local_608._0_8_ = (_Base_ptr)0x0;
    local_608._8_8_ = (_Base_ptr)0x0;
    local_5f8._0_8_ = (void *)0x0;
    local_260._M_allocated_capacity = (size_type)&local_250;
    local_260._8_8_ = 0;
    local_250._M_local_buf[0] = '\0';
    local_228 = '\0';
    local_220 = &local_210;
    local_218 = (_Base_ptr)0x0;
    local_210._M_local_buf[0] = '\0';
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    local_200._M_string_length = 0;
    local_200.field_2._M_local_buf[0] = '\0';
    local_1e0 = &local_1d0;
    local_1d8 = (pointer)0x0;
    local_1d0._M_local_buf[0] = '\0';
    local_1c0 = &local_1b0;
    local_1b8 = 0;
    local_1b0._M_local_buf[0] = '\0';
    local_1a0 = 0;
    local_178 = (pointer)0x0;
    pTStack_170 = (pointer)0x0;
    local_168 = (cmLocalGenerator *)0x0;
    uStack_188 = 0;
    uStack_187 = 0;
    local_198 = (pointer)0x0;
    local_190 = 0;
    uStack_18f = 0;
    local_598._8_8_ = (cmExportBuildFileGenerator *)0x0;
    local_588._8_8_ = &local_260;
    local_588._16_8_ = (pointer)0x0;
    local_588._24_8_ = (code *)0x0;
    local_588._32_8_ = 0;
    local_588._40_8_ = (pointer)0x0;
    local_558 = (_Base_ptr)0x0;
    aStack_550._M_allocated_capacity = 0;
    aStack_550._8_8_ = (pointer)0x0;
    auStack_540._0_8_ = (pointer)0x0;
    auStack_540._8_8_ = auStack_540._8_8_ & 0xffffffffffffff00;
    local_598._M_unused._M_object = (cmExportBuildFileGenerator *)local_2f8;
    ArgumentParser::Instance::
    Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((Instance *)&local_598,args,0);
    if ((pointer)aStack_550._8_8_ != (pointer)0x0) {
      (*(code *)aStack_550._8_8_)(&local_558,&local_558,3);
    }
    if (local_608._0_8_ != local_608._8_8_) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_688,
                     "Unknown argument: \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_608._0_8_);
      puVar12 = (undefined8 *)std::__cxx11::string::append(local_688);
      pcVar18 = (cmExportBuildFileGenerator *)(puVar12 + 2);
      if ((cmExportBuildFileGenerator *)*puVar12 == pcVar18) {
        local_588._0_8_ =
             (((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                *)&(pcVar18->super_cmExportFileGenerator)._vptr_cmExportFileGenerator)->
             super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        local_588._8_8_ = puVar12[3];
        local_598._M_unused._M_object = (cmExportBuildFileGenerator *)local_588;
      }
      else {
        local_588._0_8_ =
             (((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                *)&(pcVar18->super_cmExportFileGenerator)._vptr_cmExportFileGenerator)->
             super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        local_598._M_unused._M_object = (cmExportBuildFileGenerator *)*puVar12;
      }
      local_598._8_8_ = puVar12[1];
      *puVar12 = pcVar18;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      std::__cxx11::string::_M_assign((string *)&local_730->Error);
      if ((cmExportBuildFileGenerator *)local_598._M_unused._0_8_ !=
          (cmExportBuildFileGenerator *)local_588) {
        operator_delete(local_598._M_unused._M_object,
                        (ulong)((long)&(((vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                          *)local_588._0_8_)->
                                       super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      if ((_Any_data *)local_688._0_8_ != (_Any_data *)local_678) {
        operator_delete((void *)local_688._0_8_,(ulong)((long)local_678 + 1));
      }
      bVar8 = false;
      goto LAB_0020b115;
    }
    iVar9 = std::__cxx11::string::compare
                      ((char *)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
    if (iVar9 == 0) {
      pcVar17 = cmMakefile::GetGlobalGenerator(local_730->Makefile);
      local_5c0 = cmExportSetMap::operator[](&pcVar17->ExportSets,(string *)&local_260);
      aStack_630._8_8_ = (pointer)0x0;
      _Stack_620._M_p = (pointer)0x0;
      aStack_640._8_8_ = (_Invoker_type)0x0;
      aStack_630._M_allocated_capacity = 0;
      auStack_650._8_8_ = 0;
      aStack_640._M_allocated_capacity = 0;
      bStack_670.field_2._8_8_ = (_Invoker_type)0x0;
      auStack_650._0_8_ = (char *)0x0;
      bStack_670._M_string_length = 0;
      bStack_670.field_2._M_allocated_capacity = 0;
      local_678 = (undefined1  [8])0x0;
      bStack_670._M_dataplus._M_p = (pointer)0x0;
      local_688._0_8_ = (_Any_data *)0x0;
      local_688._8_8_ = (pointer)0x0;
      local_708._M_unused._M_object = (void *)0x0;
      local_708._8_8_ = 0;
      local_6f8._8_8_ =
           std::
           _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
           ::_M_invoke;
      local_6f8._0_8_ =
           std::
           _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
           ::_M_manager;
      name_10._M_str = "ENABLED";
      name_10._M_len = 7;
      ArgumentParser::Base::Bind((Base *)local_688,name_10,(KeywordAction *)&local_708);
      if ((_func_int **)local_6f8._0_8_ != (_func_int **)0x0) {
        (*(code *)local_6f8._0_8_)(&local_708,&local_708,3);
      }
      local_708._8_8_ = 0;
      local_708._M_unused._M_member_pointer = 0x20;
      local_6f8._8_8_ =
           std::
           _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
           ::_M_invoke;
      local_6f8._0_8_ =
           std::
           _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
           ::_M_manager;
      name_11._M_str = "EXTRA_ARGS";
      name_11._M_len = 10;
      ArgumentParser::Base::Bind((Base *)local_688,name_11,(KeywordAction *)&local_708);
      if ((cmExportSet *)local_6f8._0_8_ != (cmExportSet *)0x0) {
        (*(code *)local_6f8._0_8_)(&local_708,&local_708,3);
      }
      ArgumentParser::ActionMap::ActionMap((ActionMap *)&local_598,(ActionMap *)local_688);
      std::
      vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ::~vector((vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                 *)&aStack_630);
      if ((_Manager_type)aStack_640._M_allocated_capacity != (_Manager_type)0x0) {
        (*(code *)aStack_640._M_allocated_capacity)(auStack_650,auStack_650,3);
      }
      if ((_Manager_type)bStack_670.field_2._M_allocated_capacity != (_Manager_type)0x0) {
        (*(code *)bStack_670.field_2._M_allocated_capacity)(&bStack_670,&bStack_670,3);
      }
      std::
      vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                 *)local_688);
      pTVar5 = (pointer)CONCAT71(uStack_18f,local_190);
      if (local_198 != pTVar5) {
        local_690._M_p = (pointer)&local_730->Error;
        pTVar28 = local_198;
        do {
          local_708._M_unused._M_object = local_6f8;
          pcVar4 = (pTVar28->Name)._M_dataplus._M_p;
          local_728._8_8_ = (pTVar28->Name)._M_string_length;
          if (pcVar4 != (pointer)local_728._8_8_) {
            local_728._M_unused._0_8_ = (undefined8)(pcVar4 + 0x20);
            local_708._8_8_ = (_Any_data *)0x0;
            local_6f8._0_8_ = local_6f8._0_8_ & 0xffffffffffffff00;
            local_6e8._16_8_ = 0;
            local_6e8._0_8_ = (pointer)0x0;
            local_6e8._8_8_ = (code *)0x0;
            local_688._0_8_ = &local_598;
            local_688._8_8_ = (pointer)0x0;
            local_678 = (undefined1  [8])local_608;
            bStack_670._M_dataplus._M_p = (pointer)&local_708;
            aStack_630._8_8_ = aStack_630._8_8_ & 0xffffffffffffff00;
            aStack_640._8_8_ = (_Invoker_type)0x0;
            aStack_630._M_allocated_capacity = 0;
            auStack_650._8_8_ = 0;
            aStack_640._M_allocated_capacity = 0;
            bStack_670.field_2._8_8_ = (_Invoker_type)0x0;
            auStack_650._0_8_ = (char *)0x0;
            bStack_670._M_string_length = 0;
            bStack_670.field_2._M_allocated_capacity = 0;
            ArgumentParser::Instance::
            Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                      ((Instance *)local_688,
                       (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&local_728,0);
            if ((_Invoker_type)aStack_640._8_8_ != (_Invoker_type)0x0) {
              (*(code *)aStack_640._8_8_)(auStack_650 + 8,auStack_650 + 8,3);
            }
            if (local_608._0_8_ == local_608._8_8_) {
              pPVar15 = cmExportSet::GetPackageDependencyForSetup
                                  (local_5c0,(string *)(pTVar28->Name)._M_dataplus._M_p);
              if ((_Any_data *)local_708._8_8_ != (_Any_data *)0x0) {
                iVar9 = std::__cxx11::string::compare(local_708._M_pod_data);
                if (iVar9 == 0) {
                  PVar21 = Auto;
                }
                else {
                  value_00._M_str = (char *)local_708._M_unused._0_8_;
                  value_00._M_len = local_708._8_8_;
                  bVar8 = cmValue::IsOff(value_00);
                  PVar21 = Off;
                  if (!bVar8) {
                    value._M_str = extraout_RDX;
                    value._M_len = local_708._M_unused._0_8_;
                    bVar8 = cmValue::IsOn((cmValue *)local_708._8_8_,value);
                    PVar21 = On;
                    if (!bVar8) {
                      local_688._0_8_ = (_Any_data *)0x30;
                      local_688._8_8_ = "Invalid enable setting for package dependency: \"";
                      local_678 = (undefined1  [8])0x0;
                      bStack_670._M_dataplus._M_p = (pointer)local_708._8_8_;
                      bStack_670._M_string_length = (size_type)local_708._M_unused._0_8_;
                      bStack_670.field_2._M_allocated_capacity = 0;
                      bStack_670.field_2._8_8_ = (_Invoker_type)0x1;
                      auStack_650._0_8_ = "\"";
                      auStack_650._8_8_ = 0;
                      views._M_len = 3;
                      views._M_array = (iterator)local_688;
                      cmCatViews((string *)&local_728,views);
                      std::__cxx11::string::_M_assign((string *)local_690._M_p);
                      goto LAB_0020b76a;
                    }
                  }
                }
                pPVar15->Enabled = PVar21;
              }
              bVar8 = true;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &pPVar15->ExtraArguments,
                         (pPVar15->ExtraArguments).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,local_6e8._0_8_,local_6e8._8_8_)
              ;
            }
            else {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_728,"Unknown argument: \"",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_608._0_8_);
              plVar14 = (long *)std::__cxx11::string::append(local_728._M_pod_data);
              p_Var22 = (_Any_data *)(plVar14 + 2);
              if ((_Any_data *)*plVar14 == p_Var22) {
                local_678 = *(undefined1 (*) [8])p_Var22;
                bStack_670._M_dataplus._M_p = (pointer)plVar14[3];
                local_688._0_8_ = (_Any_data *)local_678;
              }
              else {
                local_678 = *(undefined1 (*) [8])p_Var22;
                local_688._0_8_ = (_Any_data *)*plVar14;
              }
              local_688._8_8_ = plVar14[1];
              *plVar14 = (long)p_Var22;
              plVar14[1] = 0;
              *(undefined1 *)(plVar14 + 2) = 0;
              std::__cxx11::string::_M_assign((string *)local_690._M_p);
              if ((_Any_data *)local_688._0_8_ != (_Any_data *)local_678) {
                operator_delete((void *)local_688._0_8_,(ulong)((long)local_678 + 1));
              }
LAB_0020b76a:
              if ((code **)local_728._M_unused._0_8_ != &local_718) {
                operator_delete(local_728._M_unused._M_object,(ulong)(local_718 + 1));
              }
              bVar8 = false;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_6e8);
            if ((cmExportBuildFileGenerator *)local_708._M_unused._0_8_ !=
                (cmExportBuildFileGenerator *)local_6f8) {
              operator_delete(local_708._M_unused._M_object,
                              (ulong)((long)&(((vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                                *)local_6f8._0_8_)->
                                             super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start + 1));
            }
            if (!bVar8) {
              bVar8 = false;
              goto LAB_0020bc96;
            }
          }
          pTVar28 = (pointer)((long)&(pTVar28->Name).field_2 + 8);
        } while (pTVar28 != pTVar5);
      }
      auStack_6b0._8_8_ = (pointer)0x0;
      auStack_6b0._16_8_ = 0;
      local_6b8 = (pointer)0x0;
      auStack_6b0._0_8_ = (pointer)0x0;
      local_6c8._M_allocated_capacity = 0;
      local_6c8._8_8_ = (pointer)0x0;
      local_6e8._16_8_ = 0;
      sStack_6d0 = 0;
      local_6e8._0_8_ = (pointer)0x0;
      local_6e8._8_8_ = (code *)0x0;
      local_6f8._0_8_ = (cmExportSet *)0x0;
      local_6f8._8_8_ = (_Any_data *)0x0;
      local_708._M_unused._M_object = (cmExportBuildFileGenerator *)0x0;
      local_708._8_8_ = (_Any_data *)0x0;
      local_728._M_unused._M_object = (code **)0x0;
      local_728._8_8_ = (pointer)0x0;
      local_710 = std::
                  _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
                  ::_M_invoke;
      local_718 = std::
                  _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
                  ::_M_manager;
      name_12._M_str = "XCFRAMEWORK_LOCATION";
      name_12._M_len = 0x14;
      ArgumentParser::Base::Bind((Base *)&local_708,name_12,(KeywordAction *)&local_728);
      if (local_718 != (code *)0x0) {
        (*local_718)(&local_728,&local_728,3);
      }
      ArgumentParser::ActionMap::ActionMap((ActionMap *)local_688,(ActionMap *)&local_708);
      std::
      vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ::~vector((vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                 *)auStack_6b0);
      if ((pointer)local_6c8._8_8_ != (pointer)0x0) {
        (*(code *)local_6c8._8_8_)(&sStack_6d0,&sStack_6d0,3);
      }
      if ((code *)local_6e8._8_8_ != (code *)0x0) {
        (*(code *)local_6e8._8_8_)(local_6f8 + 8,local_6f8 + 8,3);
      }
      std::
      vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                 *)&local_708);
      local_690._M_p = (pointer)pTStack_170;
      if (local_178 != pTStack_170) {
        local_730 = (cmExecutionStatus *)&local_730->Error;
        __return_storage_ptr__ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_5f8 + 0x18)
        ;
        pTVar27 = local_178;
        do {
          pcVar2 = (cmGeneratorTarget *)(pTVar27->XcFrameworkLocation)._M_dataplus._M_p;
          if (pTVar27->Target != pcVar2) {
            local_5e0._M_dataplus._M_p = (pointer)&pTVar27->Target->ObjectDirectory;
            local_728._M_unused._M_object = &local_718;
            local_728._8_8_ = (pointer)0x0;
            local_718 = (code *)((ulong)local_718 & 0xffffffffffffff00);
            local_708._M_unused._M_object = local_688;
            local_708._8_8_ = (_Any_data *)0x0;
            local_6f8._0_8_ = local_608;
            local_6f8._8_8_ = &local_728;
            auStack_6b0._8_8_ = auStack_6b0._8_8_ & 0xffffffffffffff00;
            local_6b8 = (pointer)0x0;
            auStack_6b0._0_8_ = (pointer)0x0;
            local_6c8._M_allocated_capacity = 0;
            local_6c8._8_8_ = (pointer)0x0;
            local_6e8._16_8_ = 0;
            sStack_6d0 = 0;
            local_6e8._0_8_ = (pointer)0x0;
            local_6e8._8_8_ = (code *)0x0;
            local_5e0._M_string_length = (size_type)pcVar2;
            ArgumentParser::Instance::
            Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                      ((Instance *)&local_708,
                       (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)__return_storage_ptr__,0);
            if (local_6b8 != (pointer)0x0) {
              (*(code *)local_6b8)(&local_6c8,&local_6c8,3);
            }
            uVar6 = local_608._8_8_;
            uVar26 = local_608._0_8_;
            if (local_608._0_8_ == local_608._8_8_) {
              cmExportSet::SetXcFrameworkLocation
                        (local_5c0,(string *)pTVar27->Target,(string *)&local_728);
            }
            else {
              std::operator+(__return_storage_ptr__,"Unknown argument: \"",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_608._0_8_);
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)__return_storage_ptr__);
              pcVar18 = (cmExportBuildFileGenerator *)(puVar12 + 2);
              if ((cmExportBuildFileGenerator *)*puVar12 == pcVar18) {
                local_6f8._0_8_ =
                     (((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                        *)&(pcVar18->super_cmExportFileGenerator)._vptr_cmExportFileGenerator)->
                     super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
                local_6f8._8_8_ = puVar12[3];
                local_708._M_unused._M_object = (cmExportBuildFileGenerator *)local_6f8;
              }
              else {
                local_6f8._0_8_ =
                     (((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                        *)&(pcVar18->super_cmExportFileGenerator)._vptr_cmExportFileGenerator)->
                     super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
                local_708._M_unused._M_object = (cmExportBuildFileGenerator *)*puVar12;
              }
              local_708._8_8_ = puVar12[1];
              *puVar12 = pcVar18;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              std::__cxx11::string::_M_assign((string *)local_730);
              if ((cmExportBuildFileGenerator *)local_708._M_unused._0_8_ !=
                  (cmExportBuildFileGenerator *)local_6f8) {
                operator_delete(local_708._M_unused._M_object,
                                (ulong)((long)&(((vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                                  *)local_6f8._0_8_)->
                                               super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
                operator_delete(local_5e0._M_dataplus._M_p,
                                (ulong)(local_5e0.field_2._M_allocated_capacity + 1));
              }
            }
            if ((code **)local_728._M_unused._0_8_ != &local_718) {
              operator_delete(local_728._M_unused._M_object,(ulong)(local_718 + 1));
            }
            if (uVar26 != uVar6) {
              bVar8 = false;
              goto LAB_0020bc3f;
            }
          }
          pTVar27 = (pointer)&(pTVar27->XcFrameworkLocation).field_2;
        } while (pTVar27 != (pointer)local_690._M_p);
      }
      bVar8 = true;
LAB_0020bc3f:
      std::
      vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ::~vector((vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                 *)&aStack_630);
      if ((_Manager_type)aStack_640._M_allocated_capacity != (_Manager_type)0x0) {
        (*(code *)aStack_640._M_allocated_capacity)(auStack_650,auStack_650,3);
      }
      if ((_Manager_type)bStack_670.field_2._M_allocated_capacity != (_Manager_type)0x0) {
        (*(code *)bStack_670.field_2._M_allocated_capacity)(&bStack_670,&bStack_670,3);
      }
      std::
      vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                 *)local_688);
LAB_0020bc96:
      std::
      vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ::~vector((vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                 *)auStack_540);
      if ((pointer)aStack_550._M_allocated_capacity != (pointer)0x0) {
        (*(code *)aStack_550._M_allocated_capacity)(local_588 + 0x28,local_588 + 0x28,3);
      }
      if ((code *)local_588._24_8_ != (code *)0x0) {
        (*(code *)local_588._24_8_)(local_588 + 8,local_588 + 8,3);
      }
      std::
      vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                 *)&local_598);
      goto LAB_0020b115;
    }
    local_688._0_8_ = local_678;
    local_688._8_8_ = (pointer)0x0;
    local_678 = (undefined1  [8])((ulong)local_678 & 0xffffffffffffff00);
    local_690._M_p = (pointer)local_1d8;
    if (local_1d8 != (pointer)0x0) {
      std::__cxx11::string::_M_assign((string *)local_688);
    }
    if ((pointer)local_200._M_string_length == (pointer)0x0) {
      if ((pointer)local_688._8_8_ != (pointer)0x0) goto LAB_0020bff8;
      iVar9 = std::__cxx11::string::compare
                        ((char *)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
      if (iVar9 == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_598,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_260,".cmake");
        std::__cxx11::string::operator=((string *)local_688,(string *)local_598._M_pod_data);
        if ((cmExportBuildFileGenerator *)local_598._M_unused._0_8_ !=
            (cmExportBuildFileGenerator *)local_588) {
          operator_delete(local_598._M_unused._M_object,
                          (ulong)((long)&(((vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                            *)local_588._0_8_)->
                                         super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 1));
        }
        goto LAB_0020bff8;
      }
      local_598._M_unused._M_object = (cmExportBuildFileGenerator *)local_588;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_598,"FILE <filename> option missing.","");
      std::__cxx11::string::_M_assign((string *)&local_730->Error);
      if ((cmExportBuildFileGenerator *)local_598._M_unused._0_8_ !=
          (cmExportBuildFileGenerator *)local_588) {
        operator_delete(local_598._M_unused._M_object,
                        (ulong)((long)&(((vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                          *)local_588._0_8_)->
                                       super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
LAB_0020c0e5:
      bVar8 = false;
    }
    else {
      if ((pointer)local_688._8_8_ == (pointer)0x0) {
        cmsys::SystemTools::GetFilenameLastExtension((string *)&local_598,&local_200);
        iVar9 = std::__cxx11::string::compare(local_598._M_pod_data);
        if ((cmExportBuildFileGenerator *)local_598._M_unused._0_8_ !=
            (cmExportBuildFileGenerator *)local_588) {
          operator_delete(local_598._M_unused._M_object,
                          (ulong)((long)&(((vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                            *)local_588._0_8_)->
                                         super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 1));
        }
        if (iVar9 == 0) {
          std::__cxx11::string::_M_assign((string *)local_688);
          goto LAB_0020bff8;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_598._M_pod_data);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_598,"FILE option given filename \"",0x1c);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_598,local_200._M_dataplus._M_p,
                             local_200._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,"\" which does not have an extension of \".cmake\".\n",0x30);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_assign((string *)&local_730->Error);
LAB_0020c0a9:
        if ((cmExportBuildFileGenerator *)local_708._M_unused._0_8_ !=
            (cmExportBuildFileGenerator *)local_6f8) {
          operator_delete(local_708._M_unused._M_object,
                          (ulong)((long)&(((vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                            *)local_6f8._0_8_)->
                                         super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_598._M_pod_data);
        std::ios_base::~ios_base(local_528);
        goto LAB_0020c0e5;
      }
LAB_0020bff8:
      pcVar3 = local_730->Makefile;
      bVar8 = cmsys::SystemTools::FileIsFullPath((string *)local_688);
      if (bVar8) {
        bVar8 = cmMakefile::CanIWriteThisFile(pcVar3,(string *)local_688);
        if (!bVar8) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_598._M_pod_data);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_598,"FILE option given filename \"",0x1c);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_598,(char *)local_688._0_8_,local_688._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,"\" which is in the source tree.\n",0x1f);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::_M_assign((string *)&local_730->Error);
          goto LAB_0020c0a9;
        }
      }
      else {
        psVar16 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar3);
        pcVar4 = (psVar16->_M_dataplus)._M_p;
        local_708._M_unused._M_object = (cmExportBuildFileGenerator *)local_6f8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_708,pcVar4,pcVar4 + psVar16->_M_string_length);
        std::__cxx11::string::append(local_708._M_pod_data);
        puVar12 = (undefined8 *)
                  std::__cxx11::string::_M_append(local_708._M_pod_data,local_688._0_8_);
        pcVar18 = (cmExportBuildFileGenerator *)(puVar12 + 2);
        if ((cmExportBuildFileGenerator *)*puVar12 == pcVar18) {
          local_588._0_8_ =
               (((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                  *)&(pcVar18->super_cmExportFileGenerator)._vptr_cmExportFileGenerator)->
               super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
          local_588._8_8_ = puVar12[3];
          local_598._M_unused._M_object = (cmExportBuildFileGenerator *)local_588;
        }
        else {
          local_588._0_8_ =
               (((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                  *)&(pcVar18->super_cmExportFileGenerator)._vptr_cmExportFileGenerator)->
               super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
          local_598._M_unused._M_object = (cmExportBuildFileGenerator *)*puVar12;
        }
        local_598._8_8_ = puVar12[1];
        *puVar12 = pcVar18;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_688,(string *)local_598._M_pod_data);
        if ((cmExportBuildFileGenerator *)local_598._M_unused._0_8_ !=
            (cmExportBuildFileGenerator *)local_588) {
          operator_delete(local_598._M_unused._M_object,
                          (ulong)((long)&(((vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                            *)local_588._0_8_)->
                                         super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 1));
        }
        if ((cmExportBuildFileGenerator *)local_708._M_unused._0_8_ !=
            (cmExportBuildFileGenerator *)local_6f8) {
          operator_delete(local_708._M_unused._M_object,
                          (ulong)((long)&(((vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                            *)local_6f8._0_8_)->
                                         super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 1));
        }
      }
      local_728._M_unused._M_object = (code **)0x0;
      local_728._8_8_ = (pointer)0x0;
      local_718 = (code *)0x0;
      pcVar17 = cmMakefile::GetGlobalGenerator(pcVar3);
      iVar9 = std::__cxx11::string::compare
                        ((char *)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
      if (iVar9 == 0) {
        iVar19 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
                         *)&pcVar17->ExportSets,(key_type *)&local_260);
        if ((_Rb_tree_header *)iVar19._M_node ==
            &(pcVar17->ExportSets).
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
             ._M_t._M_impl.super__Rb_tree_header) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_598._M_pod_data);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_598,"Export set \"",0xc);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_598,(char *)local_260._M_allocated_capacity,
                               local_260._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\" not found.",0xc);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::_M_assign((string *)&local_730->Error);
LAB_0020c7cd:
          if ((cmExportBuildFileGenerator *)local_708._M_unused._0_8_ !=
              (cmExportBuildFileGenerator *)local_6f8) {
            operator_delete(local_708._M_unused._M_object,
                            (ulong)((long)&(((vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                              *)local_6f8._0_8_)->
                                           super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_598._M_pod_data);
          std::ios_base::~ios_base(local_528);
          goto LAB_0020c809;
        }
        pcVar25 = (cmExportSet *)(iVar19._M_node + 2);
LAB_0020c432:
        pcVar18 = cmGlobalGenerator::GetExportedTargetsFile(pcVar17,(string *)local_688);
        if ((pcVar18 != (cmExportBuildFileGenerator *)0x0) &&
           (PVar11 = cmMakefile::GetPolicyStatus(pcVar3,CMP0103,false), PVar11 != OLD)) {
          if (PVar11 != WARN) {
            cmStrCat<char_const(&)[42],std::__cxx11::string_const&,char_const(&)[32]>
                      ((string *)&local_598,(char (*) [42])0x7af996,&local_200,
                       (char (*) [32])"\nDid you miss \'APPEND\' keyword?");
            std::__cxx11::string::_M_assign((string *)&local_730->Error);
            pcVar25 = (cmExportSet *)local_588._0_8_;
            uVar26 = local_598._M_unused._0_8_;
            if ((cmExportBuildFileGenerator *)local_598._M_unused._0_8_ !=
                (cmExportBuildFileGenerator *)local_588) goto LAB_0020c3a1;
            goto LAB_0020c809;
          }
          cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&local_708,(cmPolicies *)0x67,id);
          local_5e0._M_dataplus._M_p._0_1_ = 10;
          cmStrCat<std::__cxx11::string,char,char_const(&)[51],std::__cxx11::string_const&,char_const(&)[32]>
                    ((string *)&local_598,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_708
                     ,local_5f8 + 0x18,
                     (char (*) [51])"export() command already specified for the file\n  ",&local_200
                     ,(char (*) [32])"\nDid you miss \'APPEND\' keyword?");
          cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,(string *)&local_598);
          if ((cmExportBuildFileGenerator *)local_598._M_unused._0_8_ !=
              (cmExportBuildFileGenerator *)local_588) {
            operator_delete(local_598._M_unused._M_object,
                            (ulong)((long)&(((vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                              *)local_588._0_8_)->
                                           super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start + 1));
          }
          if ((cmExportBuildFileGenerator *)local_708._M_unused._0_8_ !=
              (cmExportBuildFileGenerator *)local_6f8) {
            operator_delete(local_708._M_unused._M_object,
                            (ulong)((long)&(((vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                              *)local_6f8._0_8_)->
                                           super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start + 1));
          }
        }
        if ((pointer)local_690._M_p == (pointer)0x0) {
          std::make_unique<cmExportBuildFileGenerator>();
        }
        else {
          std::make_unique<cmExportBuildAndroidMKGenerator>();
        }
        uVar26 = local_598._M_unused._0_8_;
        cmExportFileGenerator::SetExportFile
                  ((cmExportFileGenerator *)local_598._M_unused._0_8_,(char *)local_688._0_8_);
        std::__cxx11::string::_M_assign((string *)(uVar26 + 8));
        local_280._M_allocated_capacity = (size_type)local_270;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_280,local_1c0,local_1b8 + (long)local_1c0);
        std::__cxx11::string::operator=((string *)(uVar26 + 0x198),(string *)local_280._M_local_buf)
        ;
        if ((_Alloc_hider *)local_280._M_allocated_capacity != local_270) {
          operator_delete((void *)local_280._M_allocated_capacity,(ulong)(local_270[0]._M_p + 1));
        }
        *(char *)(uVar26 + 200) = (char)local_1a0;
        if (pcVar25 == (cmExportSet *)0x0) {
          std::
          vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
          ::operator=((vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                       *)(uVar26 + 0x158),
                      (vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                       *)&local_728);
        }
        else {
          cmExportBuildFileGenerator::SetExportSet((cmExportBuildFileGenerator *)uVar26,pcVar25);
        }
        *(bool *)(uVar26 + 0x28) = local_1a0._1_1_;
        *(bool *)(uVar26 + 0x154) = uStack_187._7_1_;
        cmMakefile::GetGeneratorConfigs_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_598,pcVar3,IncludeEmptyConfig);
        uVar6 = local_598._8_8_;
        for (config = local_598._M_unused._0_8_; config != uVar6;
            config = (long)&(((cmExportBuildFileGenerator *)config)->super_cmExportFileGenerator).
                            Namespace.field_2 + 8) {
          cmExportFileGenerator::AddConfiguration((cmExportFileGenerator *)uVar26,(string *)config);
        }
        if (pcVar25 == (cmExportSet *)0x0) {
          cmGlobalGenerator::AddBuildExportSet(pcVar17,(cmExportBuildFileGenerator *)uVar26);
        }
        else {
          cmGlobalGenerator::AddBuildExportExportSet(pcVar17,(cmExportBuildFileGenerator *)uVar26);
        }
        local_610 = (undefined1  [8])uVar26;
        cmMakefile::AddExportBuildFileGenerator
                  (pcVar3,(unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                           *)local_610);
        if (local_610 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_610 + 8))();
        }
        local_610 = (undefined1  [8])0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_598);
        bVar8 = true;
      }
      else if (local_228 == '\x01') {
        if (local_240._M_allocated_capacity != local_240._8_8_) {
          uVar26 = local_240._M_allocated_capacity;
          do {
            bVar8 = cmMakefile::IsAlias(pcVar3,(string *)uVar26);
            if (bVar8) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_598._M_pod_data);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_598,"given ALIAS target \"",0x14);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_598,(((string *)uVar26)->_M_dataplus)._M_p,
                                   ((string *)uVar26)->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,"\" which may not be exported.",0x1c);
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::_M_assign((string *)&local_730->Error);
              goto LAB_0020c7cd;
            }
            this = cmGlobalGenerator::FindTarget(pcVar17,(string *)uVar26,false);
            if (this == (cmTarget *)0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_598._M_pod_data);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_598,"given target \"",0xe);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_598,(((string *)uVar26)->_M_dataplus)._M_p,
                                   ((string *)uVar26)->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,"\" which is not built by this project.",0x25);
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::_M_assign((string *)&local_730->Error);
              goto LAB_0020c7cd;
            }
            TVar10 = cmTarget::GetType(this);
            if (TVar10 == UTILITY) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_708,"given custom target \"",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             uVar26);
              puVar12 = (undefined8 *)std::__cxx11::string::append(local_708._M_pod_data);
              pcVar18 = (cmExportBuildFileGenerator *)(puVar12 + 2);
              if ((cmExportBuildFileGenerator *)*puVar12 == pcVar18) {
                local_588._0_8_ =
                     (((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                        *)&(pcVar18->super_cmExportFileGenerator)._vptr_cmExportFileGenerator)->
                     super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
                local_588._8_8_ = puVar12[3];
                local_598._M_unused._M_object = (cmExportBuildFileGenerator *)local_588;
              }
              else {
                local_588._0_8_ =
                     (((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                        *)&(pcVar18->super_cmExportFileGenerator)._vptr_cmExportFileGenerator)->
                     super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
                local_598._M_unused._M_object = (cmExportBuildFileGenerator *)*puVar12;
              }
              local_598._8_8_ = puVar12[1];
              *puVar12 = pcVar18;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              std::__cxx11::string::_M_assign((string *)&local_730->Error);
              if ((cmExportBuildFileGenerator *)local_598._M_unused._0_8_ !=
                  (cmExportBuildFileGenerator *)local_588) {
                operator_delete(local_598._M_unused._M_object,
                                (ulong)((long)&(((vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                                  *)local_588._0_8_)->
                                               super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start + 1));
              }
              pcVar25 = (cmExportSet *)local_6f8._0_8_;
              uVar26 = local_708._M_unused._0_8_;
              if ((cmExportBuildFileGenerator *)local_708._M_unused._0_8_ ==
                  (cmExportBuildFileGenerator *)local_6f8) goto LAB_0020c809;
              goto LAB_0020c3a1;
            }
            local_598._8_8_ = (cmExportBuildFileGenerator *)0x0;
            local_588._0_8_ = local_588._0_8_ & 0xffffffffffffff00;
            local_598._M_unused._M_object = (cmExportBuildFileGenerator *)local_588;
            std::
            vector<cmExportBuildFileGenerator::TargetExport,std::allocator<cmExportBuildFileGenerator::TargetExport>>
            ::emplace_back<std::__cxx11::string_const&,std::__cxx11::string>
                      ((vector<cmExportBuildFileGenerator::TargetExport,std::allocator<cmExportBuildFileGenerator::TargetExport>>
                        *)local_728._M_pod_data,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar26,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_598);
            if ((cmExportBuildFileGenerator *)local_598._M_unused._0_8_ !=
                (cmExportBuildFileGenerator *)local_588) {
              operator_delete(local_598._M_unused._M_object,
                              (ulong)((long)&(((vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                                *)local_588._0_8_)->
                                             super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start + 1));
            }
            uVar26 = uVar26 + 0x20;
          } while (uVar26 != local_240._8_8_);
        }
        if (((char)local_1a0 != '\x01') ||
           (pcVar18 = cmGlobalGenerator::GetExportedTargetsFile(pcVar17,(string *)local_688),
           pcVar18 == (cmExportBuildFileGenerator *)0x0)) {
          pcVar25 = (cmExportSet *)0x0;
          goto LAB_0020c432;
        }
        bVar8 = true;
        std::
        vector<cmExportBuildFileGenerator::TargetExport,std::allocator<cmExportBuildFileGenerator::TargetExport>>
        ::
        _M_range_insert<__gnu_cxx::__normal_iterator<cmExportBuildFileGenerator::TargetExport_const*,std::vector<cmExportBuildFileGenerator::TargetExport,std::allocator<cmExportBuildFileGenerator::TargetExport>>>>
                  ((vector<cmExportBuildFileGenerator::TargetExport,std::allocator<cmExportBuildFileGenerator::TargetExport>>
                    *)&pcVar18->Targets,
                   (pcVar18->Targets).
                   super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                   ._M_impl.super__Vector_impl_data._M_finish,local_728._M_unused._M_object,
                   local_728._8_8_);
      }
      else {
        local_598._M_unused._M_object = (cmExportBuildFileGenerator *)local_588;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_598,"EXPORT or TARGETS specifier missing.","");
        std::__cxx11::string::_M_assign((string *)&local_730->Error);
        pcVar25 = (cmExportSet *)local_588._0_8_;
        uVar26 = local_598._M_unused._0_8_;
        if ((cmExportBuildFileGenerator *)local_598._M_unused._0_8_ !=
            (cmExportBuildFileGenerator *)local_588) {
LAB_0020c3a1:
          operator_delete((void *)uVar26,
                          (ulong)((long)&(pcVar25->TargetExports).
                                         super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 1));
        }
LAB_0020c809:
        bVar8 = false;
      }
      std::
      vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
      ::~vector((vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                 *)&local_728);
    }
    if ((_Any_data *)local_688._0_8_ != (_Any_data *)local_678) {
      operator_delete((void *)local_688._0_8_,(ulong)((long)local_678 + 1));
    }
LAB_0020b115:
    cmExportCommand::Arguments::~Arguments((Arguments *)&local_260);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_608);
    std::
    vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ::~vector((vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
               *)&local_2a0);
    if ((code *)local_2b0._M_p != (code *)0x0) {
      (*(code *)local_2b0._M_p)(&local_2c0,&local_2c0,3);
    }
    if (local_2d0 != (_Manager_type)0x0) {
      (*local_2d0)((_Any_data *)&local_2e0,(_Any_data *)&local_2e0,__destroy_functor);
    }
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
               *)local_2f8);
    return bVar8;
  }
  local_5b0 = 0;
  local_5a8[0] = '\0';
  local_5b8 = local_5a8;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
LAB_0020b285:
    local_260._M_allocated_capacity = 0x25;
    local_598._M_unused._M_object = local_588;
    local_598._M_unused._0_8_ =
         (undefined8)
         std::__cxx11::string::_M_create((ulong *)local_598._M_pod_data,(ulong)&local_260);
    local_588._0_8_ = local_260._M_allocated_capacity;
    *(undefined8 *)((long)local_598._M_unused._0_8_ + 0x10) = 0x2061206e65766967;
    *(undefined8 *)((long)local_598._M_unused._0_8_ + 0x18) = 0x206567616b636170;
    *(undefined8 *)local_598._M_unused._0_8_ = 0x204547414b434150;
    *(undefined8 *)((long)local_598._M_unused._0_8_ + 8) = 0x206562207473756d;
    *(undefined8 *)((long)local_598._M_unused._0_8_ + 0x1d) = 0x2e656d616e206567;
    local_598._8_8_ = local_260._M_allocated_capacity;
    *(char *)((long)local_598._M_unused._0_8_ + local_260._M_allocated_capacity) = '\0';
    std::__cxx11::string::_M_assign((string *)&local_730->Error);
    if ((undefined1 *)local_598._M_unused._0_8_ != local_588) {
      operator_delete(local_598._M_unused._M_object,local_588._0_8_ + 1);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_5b8);
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) < 0x41) {
      if (local_5b0 != 0) {
        local_50 = 0;
        local_40 = (void *)0x0;
        local_38 = 0;
        memset(&local_260,0,0x20a);
        cmsys::RegularExpression::compile((RegularExpression *)&local_260,"^[A-Za-z0-9_.-]+$");
        bVar8 = cmsys::RegularExpression::find
                          ((RegularExpression *)&local_260,local_5b8,
                           (RegularExpressionMatch *)&local_260);
        if (bVar8) {
          pcVar3 = local_730->Makefile;
          PVar11 = cmMakefile::GetPolicyStatus(pcVar3,CMP0090,false);
          if (PVar11 - NEW < 3) {
            local_598._M_unused._M_object = local_588;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_598,"CMAKE_EXPORT_PACKAGE_REGISTRY","");
            bVar7 = cmMakefile::IsOn(pcVar3,(string *)&local_598);
            if ((undefined1 *)local_598._M_unused._0_8_ != local_588) {
              operator_delete(local_598._M_unused._M_object,local_588._0_8_ + 1);
            }
            if (!bVar7) goto LAB_0020c9a4;
          }
          else if (PVar11 < NEW) {
            local_598._M_unused._M_object = local_588;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_598,"CMAKE_EXPORT_NO_PACKAGE_REGISTRY","");
            bVar7 = cmMakefile::IsOn(pcVar3,(string *)&local_598);
            if ((undefined1 *)local_598._M_unused._0_8_ != local_588) {
              operator_delete(local_598._M_unused._M_object,local_588._0_8_ + 1);
            }
            if (bVar7) goto LAB_0020c9a4;
          }
          psVar16 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar3);
          cmCryptoHash::cmCryptoHash(&local_328,AlgoMD5);
          input._M_str = (psVar16->_M_dataplus)._M_p;
          input._M_len = psVar16->_M_string_length;
          cmCryptoHash::HashString_abi_cxx11_(&local_318,&local_328,input);
          pcVar23 = (psVar16->_M_dataplus)._M_p;
          local_728._8_8_ = (pointer)0x0;
          local_718 = (code *)((ulong)local_718 & 0xffffffffffffff00);
          local_728._M_unused._M_object = &local_718;
          bVar7 = cmsys::SystemTools::GetEnv("HOME",(string *)&local_728);
          if (bVar7) {
            cmsys::SystemTools::ConvertToUnixSlashes((string *)&local_728);
            std::__cxx11::string::append(local_728._M_pod_data);
            std::__cxx11::string::_M_append(local_728._M_pod_data,(ulong)local_5b8);
            cmsys::SystemTools::MakeDirectory((string *)&local_728,(mode_t *)0x0);
            std::__cxx11::string::append(local_728._M_pod_data);
            std::__cxx11::string::append(local_728._M_pod_data);
            bVar7 = cmsys::SystemTools::FileExists((string *)&local_728);
            if (!bVar7) {
              cmGeneratedFileStream::cmGeneratedFileStream
                        ((cmGeneratedFileStream *)&local_598,(string *)&local_728,true,None);
              if ((*(uint *)(local_588 +
                            *(long *)(local_598._M_unused._M_function_pointer + -0x18) + 0x10) & 5)
                  == 0) {
                if (pcVar23 == (char *)0x0) {
                  std::ios::clear((int)auStack_738 +
                                  (int)*(long *)(local_598._M_unused._M_function_pointer + -0x18) +
                                  0x1a0);
                }
                else {
                  sVar20 = strlen(pcVar23);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_598,pcVar23,sVar20);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_598,"\n",1);
              }
              else {
                cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
                local_2f8._0_8_ = (pointer)0x27;
                local_2f8._8_8_ = "Cannot create package registry file:\n  ";
                local_2f8._16_8_ = (pointer)0x0;
                local_2e0._M_allocated_capacity = local_728._8_8_;
                local_2e0._8_8_ = local_728._M_unused._M_object;
                local_2d0 = (_Manager_type)0x0;
                local_678 = (undefined1  [8])&bStack_670;
                local_688._0_8_ = (_Any_data *)0x0;
                local_688._8_8_ = (pointer)0x1;
                bStack_670._M_dataplus._M_p._0_1_ = 10;
                local_2c8 = (pointer)0x1;
                local_2c0._8_8_ = (pointer)0x0;
                local_2b0._M_p = (pointer)local_608._8_8_;
                local_2a8 = (_Base_ptr)local_608._0_8_;
                local_6f8._0_8_ = local_6f8 + 8;
                local_708._M_unused._M_object = (cmExportBuildFileGenerator *)0x0;
                local_708._8_8_ = (_Any_data *)0x1;
                local_6f8[8] = 10;
                local_2a0._8_8_ = 1;
                local_288 = 0;
                views_00._M_len = 5;
                views_00._M_array = (iterator)local_2f8;
                local_2c0._M_unused._0_8_ = (undefined8)local_678;
                local_2a0._M_allocated_capacity = (size_type)local_608;
                local_290._M_p = (pointer)local_6f8._0_8_;
                cmCatViews((string *)(local_5f8 + 0x18),views_00);
                cmMakefile::IssueMessage(pcVar3,WARNING,(string *)(local_5f8 + 0x18));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
                  operator_delete(local_5e0._M_dataplus._M_p,
                                  (ulong)(local_5e0.field_2._M_allocated_capacity + 1));
                }
                if ((_Base_ptr)local_608._0_8_ != (_Base_ptr)(local_608 + 0x10)) {
                  operator_delete((void *)local_608._0_8_,(ulong)(local_5f8._0_8_ + 1));
                }
              }
              cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&local_598);
            }
          }
          if ((code **)local_728._M_unused._0_8_ != &local_718) {
            operator_delete(local_728._M_unused._M_object,(ulong)(local_718 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          cmCryptoHash::~cmCryptoHash(&local_328);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_598._M_pod_data);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_598,"PACKAGE given invalid package name \"",0x24);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_598,local_5b8,local_5b0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\".  ",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,"Package names must match \"",0x1a);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"^[A-Za-z0-9_.-]+$",0x11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\".",2);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::_M_assign((string *)&local_730->Error);
          if ((pointer)local_2f8._0_8_ != (pointer)(local_2f8 + 0x10)) {
            operator_delete((void *)local_2f8._0_8_,
                            (ulong)((long)&((basic_string_view<char,_std::char_traits<char>_> *)
                                           local_2f8._16_8_)->_M_len + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_598._M_pod_data);
          std::ios_base::~ios_base(local_528);
        }
LAB_0020c9a4:
        if (local_40 != (void *)0x0) {
          operator_delete__(local_40);
        }
        goto LAB_0020b31e;
      }
      goto LAB_0020b285;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_598._M_pod_data);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_598,"PACKAGE given unknown argument: ",0x20);
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_598,pbVar1[2]._M_dataplus._M_p,pbVar1[2]._M_string_length);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_assign((string *)&local_730->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_allocated_capacity != &local_250) {
      operator_delete((void *)local_260._M_allocated_capacity,
                      CONCAT71(local_250._M_allocated_capacity._1_7_,local_250._M_local_buf[0]) + 1)
      ;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_598._M_pod_data);
    std::ios_base::~ios_base(local_528);
  }
  bVar8 = false;
LAB_0020b31e:
  if (local_5b8 != local_5a8) {
    operator_delete(local_5b8,CONCAT71(local_5a8._1_7_,local_5a8[0]) + 1);
  }
  return bVar8;
}

Assistant:

bool cmExportCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with too few arguments");
    return false;
  }

  if (args[0] == "PACKAGE") {
    return HandlePackage(args, status);
  }

  struct Arguments
  {
    std::string ExportSetName;
    cm::optional<ArgumentParser::MaybeEmpty<std::vector<std::string>>> Targets;
    std::string Namespace;
    std::string Filename;
    std::string AndroidMKFile;
    std::string CxxModulesDirectory;
    bool Append = false;
    bool ExportOld = false;

    std::vector<std::vector<std::string>> PackageDependencyArgs;
    bool ExportPackageDependencies = false;

    std::vector<std::vector<std::string>> TargetArgs;
  };

  auto parser =
    cmArgumentParser<Arguments>{}
      .Bind("NAMESPACE"_s, &Arguments::Namespace)
      .Bind("FILE"_s, &Arguments::Filename)
      .Bind("CXX_MODULES_DIRECTORY"_s, &Arguments::CxxModulesDirectory);

  if (args[0] == "EXPORT") {
    parser.Bind("EXPORT"_s, &Arguments::ExportSetName);
    if (cmExperimental::HasSupportEnabled(
          status.GetMakefile(),
          cmExperimental::Feature::ExportPackageDependencies)) {
      parser.Bind("EXPORT_PACKAGE_DEPENDENCIES"_s,
                  &Arguments::ExportPackageDependencies);
    }
  } else if (args[0] == "SETUP") {
    parser.Bind("SETUP"_s, &Arguments::ExportSetName);
    if (cmExperimental::HasSupportEnabled(
          status.GetMakefile(),
          cmExperimental::Feature::ExportPackageDependencies)) {
      parser.Bind("PACKAGE_DEPENDENCY"_s, &Arguments::PackageDependencyArgs);
    }
    parser.Bind("TARGET"_s, &Arguments::TargetArgs);
  } else {
    parser.Bind("TARGETS"_s, &Arguments::Targets);
    parser.Bind("ANDROID_MK"_s, &Arguments::AndroidMKFile);
    parser.Bind("APPEND"_s, &Arguments::Append);
    parser.Bind("EXPORT_LINK_INTERFACE_LIBRARIES"_s, &Arguments::ExportOld);
  }

  std::vector<std::string> unknownArgs;
  Arguments const arguments = parser.Parse(args, &unknownArgs);

  if (!unknownArgs.empty()) {
    status.SetError("Unknown argument: \"" + unknownArgs.front() + "\".");
    return false;
  }

  if (args[0] == "SETUP") {
    cmMakefile& mf = status.GetMakefile();
    cmGlobalGenerator* gg = mf.GetGlobalGenerator();

    cmExportSetMap& setMap = gg->GetExportSets();
    auto& exportSet = setMap[arguments.ExportSetName];

    struct PackageDependencyArguments
    {
      std::string Enabled;
      ArgumentParser::MaybeEmpty<std::vector<std::string>> ExtraArgs;
    };

    auto packageDependencyParser =
      cmArgumentParser<PackageDependencyArguments>{}
        .Bind("ENABLED"_s, &PackageDependencyArguments::Enabled)
        .Bind("EXTRA_ARGS"_s, &PackageDependencyArguments::ExtraArgs);

    for (auto const& packageDependencyArgs : arguments.PackageDependencyArgs) {
      if (packageDependencyArgs.empty()) {
        continue;
      }

      PackageDependencyArguments const packageDependencyArguments =
        packageDependencyParser.Parse(
          cmMakeRange(packageDependencyArgs).advance(1), &unknownArgs);

      if (!unknownArgs.empty()) {
        status.SetError("Unknown argument: \"" + unknownArgs.front() + "\".");
        return false;
      }

      auto& packageDependency =
        exportSet.GetPackageDependencyForSetup(packageDependencyArgs.front());

      if (!packageDependencyArguments.Enabled.empty()) {
        if (packageDependencyArguments.Enabled == "AUTO") {
          packageDependency.Enabled =
            cmExportSet::PackageDependencyExportEnabled::Auto;
        } else if (cmIsOff(packageDependencyArguments.Enabled)) {
          packageDependency.Enabled =
            cmExportSet::PackageDependencyExportEnabled::Off;
        } else if (cmIsOn(packageDependencyArguments.Enabled)) {
          packageDependency.Enabled =
            cmExportSet::PackageDependencyExportEnabled::On;
        } else {
          status.SetError(
            cmStrCat("Invalid enable setting for package dependency: \"",
                     packageDependencyArguments.Enabled, "\""));
          return false;
        }
      }

      cm::append(packageDependency.ExtraArguments,
                 packageDependencyArguments.ExtraArgs);
    }

    struct TargetArguments
    {
      std::string XcFrameworkLocation;
    };

    auto targetParser = cmArgumentParser<TargetArguments>{}.Bind(
      "XCFRAMEWORK_LOCATION"_s, &TargetArguments::XcFrameworkLocation);

    for (auto const& targetArgs : arguments.TargetArgs) {
      if (targetArgs.empty()) {
        continue;
      }

      TargetArguments const targetArguments =
        targetParser.Parse(cmMakeRange(targetArgs).advance(1), &unknownArgs);

      if (!unknownArgs.empty()) {
        status.SetError("Unknown argument: \"" + unknownArgs.front() + "\".");
        return false;
      }

      exportSet.SetXcFrameworkLocation(targetArgs.front(),
                                       targetArguments.XcFrameworkLocation);
    }

    return true;
  }

  std::string fname;
  bool android = false;
  if (!arguments.AndroidMKFile.empty()) {
    fname = arguments.AndroidMKFile;
    android = true;
  }
  if (arguments.Filename.empty() && fname.empty()) {
    if (args[0] != "EXPORT") {
      status.SetError("FILE <filename> option missing.");
      return false;
    }
    fname = arguments.ExportSetName + ".cmake";
  } else if (fname.empty()) {
    // Make sure the file has a .cmake extension.
    if (cmSystemTools::GetFilenameLastExtension(arguments.Filename) !=
        ".cmake") {
      std::ostringstream e;
      e << "FILE option given filename \"" << arguments.Filename
        << "\" which does not have an extension of \".cmake\".\n";
      status.SetError(e.str());
      return false;
    }
    fname = arguments.Filename;
  }

  cmMakefile& mf = status.GetMakefile();

  // Get the file to write.
  if (cmSystemTools::FileIsFullPath(fname)) {
    if (!mf.CanIWriteThisFile(fname)) {
      std::ostringstream e;
      e << "FILE option given filename \"" << fname
        << "\" which is in the source tree.\n";
      status.SetError(e.str());
      return false;
    }
  } else {
    // Interpret relative paths with respect to the current build dir.
    std::string const& dir = mf.GetCurrentBinaryDirectory();
    fname = dir + "/" + fname;
  }

  std::vector<cmExportBuildFileGenerator::TargetExport> targets;

  cmGlobalGenerator* gg = mf.GetGlobalGenerator();

  cmExportSet* exportSet = nullptr;
  if (args[0] == "EXPORT") {
    cmExportSetMap& setMap = gg->GetExportSets();
    auto const it = setMap.find(arguments.ExportSetName);
    if (it == setMap.end()) {
      std::ostringstream e;
      e << "Export set \"" << arguments.ExportSetName << "\" not found.";
      status.SetError(e.str());
      return false;
    }
    exportSet = &it->second;
  } else if (arguments.Targets) {
    for (std::string const& currentTarget : *arguments.Targets) {
      if (mf.IsAlias(currentTarget)) {
        std::ostringstream e;
        e << "given ALIAS target \"" << currentTarget
          << "\" which may not be exported.";
        status.SetError(e.str());
        return false;
      }

      if (cmTarget* target = gg->FindTarget(currentTarget)) {
        if (target->GetType() == cmStateEnums::UTILITY) {
          status.SetError("given custom target \"" + currentTarget +
                          "\" which may not be exported.");
          return false;
        }
      } else {
        std::ostringstream e;
        e << "given target \"" << currentTarget
          << "\" which is not built by this project.";
        status.SetError(e.str());
        return false;
      }
      targets.emplace_back(currentTarget, std::string{});
    }
    if (arguments.Append) {
      if (cmExportBuildFileGenerator* ebfg =
            gg->GetExportedTargetsFile(fname)) {
        ebfg->AppendTargets(targets);
        return true;
      }
    }
  } else {
    status.SetError("EXPORT or TARGETS specifier missing.");
    return false;
  }

  // if cmExportBuildFileGenerator is already defined for the file
  // and APPEND is not specified, if CMP0103 is OLD ignore previous definition
  // else raise an error
  if (gg->GetExportedTargetsFile(fname) != nullptr) {
    switch (mf.GetPolicyStatus(cmPolicies::CMP0103)) {
      case cmPolicies::WARN:
        mf.IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0103), '\n',
                   "export() command already specified for the file\n  ",
                   arguments.Filename, "\nDid you miss 'APPEND' keyword?"));
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      default:
        status.SetError(cmStrCat("command already specified for the file\n  ",
                                 arguments.Filename,
                                 "\nDid you miss 'APPEND' keyword?"));
        return false;
    }
  }

  // Setup export file generation.
  std::unique_ptr<cmExportBuildFileGenerator> ebfg = nullptr;
  if (android) {
    ebfg = cm::make_unique<cmExportBuildAndroidMKGenerator>();
  } else {
    ebfg = cm::make_unique<cmExportBuildFileGenerator>();
  }
  ebfg->SetExportFile(fname.c_str());
  ebfg->SetNamespace(arguments.Namespace);
  ebfg->SetCxxModuleDirectory(arguments.CxxModulesDirectory);
  ebfg->SetAppendMode(arguments.Append);
  if (exportSet != nullptr) {
    ebfg->SetExportSet(exportSet);
  } else {
    ebfg->SetTargets(targets);
  }
  ebfg->SetExportOld(arguments.ExportOld);
  ebfg->SetExportPackageDependencies(arguments.ExportPackageDependencies);

  // Compute the set of configurations exported.
  std::vector<std::string> configurationTypes =
    mf.GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  for (std::string const& ct : configurationTypes) {
    ebfg->AddConfiguration(ct);
  }
  if (exportSet != nullptr) {
    gg->AddBuildExportExportSet(ebfg.get());
  } else {
    gg->AddBuildExportSet(ebfg.get());
  }
  mf.AddExportBuildFileGenerator(std::move(ebfg));

  return true;
}